

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O1

bool D_LoadDehLump(int lumpnum)

{
  bool bVar1;
  FString local_20;
  
  PatchSize = FWadCollection::LumpLength(&Wads,lumpnum);
  FWadCollection::GetLumpFullPath((FWadCollection *)&stack0xffffffffffffffe0,0xa861c0);
  PatchName = copystring(local_20.Chars);
  FString::~FString(&stack0xffffffffffffffe0);
  PatchFile = (char *)operator_new__((long)PatchSize + 1);
  FWadCollection::ReadLump(&Wads,lumpnum,PatchFile);
  PatchFile[PatchSize] = '\0';
  bVar1 = DoDehPatch();
  return bVar1;
}

Assistant:

bool D_LoadDehLump(int lumpnum)
{
	PatchSize = Wads.LumpLength(lumpnum);

	PatchName = copystring(Wads.GetLumpFullPath(lumpnum));
	PatchFile = new char[PatchSize + 1];
	Wads.ReadLump(lumpnum, PatchFile);
	PatchFile[PatchSize] = '\0';		// terminate with a '\0' character
	return DoDehPatch();
}